

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O3

void __thiscall Am_Object_Data::remove_temporary_slot(Am_Object_Data *this,Am_Slot_Key key)

{
  char *pcVar1;
  Am_Slot_Data *this_00;
  Am_Object_Data *this_01;
  uint uVar2;
  Am_Slot_Data *in_RAX;
  long lVar3;
  Am_Slot local_38;
  
  uVar2 = (this->data).length;
  local_38.data = in_RAX;
  if (uVar2 != 0) {
    pcVar1 = (this->data).data;
    lVar3 = 0;
    do {
      this_00 = *(Am_Slot_Data **)(pcVar1 + lVar3 * 8);
      if (this_00->key == key) {
        if ((this_00->field_0x38 & 2) == 0) {
          return;
        }
        DynArray::Delete(&this->data,(uint)lVar3);
        local_38.data = this_00;
        am_CList::Invalidate
                  (&this_00->dependencies,&local_38,(Am_Constraint *)0x0,&this_00->super_Am_Value);
        Am_Slot_Data::Destroy(this_00);
        uVar2 = (this->data).length;
      }
      lVar3 = lVar3 + 1;
    } while ((uint)lVar3 < uVar2);
  }
  for (this_01 = this->first_instance; this_01 != (Am_Object_Data *)0x0;
      this_01 = this_01->next_instance) {
    remove_temporary_slot(this_01,key);
  }
  return;
}

Assistant:

void
Am_Object_Data::remove_temporary_slot(Am_Slot_Key key)
{
  unsigned i;
  Am_Slot_Data **slot_array;
  Am_Slot_Data *slot;

  for (i = 0, slot_array = (Am_Slot_Data **)data.data; i < data.length;
       ++i, ++slot_array) {
    slot = *slot_array;
    if (key == slot->key) {
      if (slot->flags & BIT_INHERITS) {
        data.Delete(i);
        slot->dependencies.Invalidate(slot, nullptr, *slot);
        slot->Destroy();
      } else
        return;
    }
  }
  remove_temporaries(key);
}